

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

void __thiscall
Eigen::SparseMatrix<double,_1,_int>::sumupDuplicates(SparseMatrix<double,_1,_int> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Index *__ptr;
  Index *pIVar4;
  Index *pIVar5;
  Scalar_conflict *pSVar6;
  void *__s;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  __ptr = this->m_innerNonZeros;
  if (__ptr == (Index *)0x0) {
    __assert_fail("!isCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                  ,0x3fc,
                  "void Eigen::SparseMatrix<double, 1>::sumupDuplicates() [_Scalar = double, _Flags = 1, _Index = int]"
                 );
  }
  uVar1 = this->m_innerSize;
  lVar12 = (long)(int)uVar1;
  if (lVar12 == 0) {
    uVar13 = 0;
    __s = (void *)0x0;
  }
  else {
    if (((int)uVar1 < 0) || (__s = malloc(lVar12 * 4), __s == (void *)0x0)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::streambuf::xsgetn;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar13 = (ulong)(uVar1 & 0x7ffffffc);
    if (3 < uVar1) {
      memset(__s,0xff,uVar13 * 4);
    }
  }
  if ((long)uVar13 < lVar12) {
    memset((void *)((long)__s + (ulong)(uVar1 >> 2) * 0x10),0xff,
           lVar12 * 4 + (ulong)(uVar1 >> 2) * -0x10);
  }
  lVar12 = (long)this->m_outerSize;
  pIVar4 = this->m_outerIndex;
  if (lVar12 < 1) {
    iVar9 = 0;
  }
  else {
    pIVar5 = (this->m_data).m_indices;
    lVar8 = 0;
    iVar10 = 0;
    do {
      iVar9 = iVar10;
      if (0 < (long)__ptr[lVar8]) {
        lVar11 = (long)pIVar4[lVar8];
        lVar12 = __ptr[lVar8] + lVar11;
        pSVar6 = (this->m_data).m_values;
        do {
          uVar2 = pIVar5[lVar11];
          if (uVar1 <= uVar2) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                         );
          }
          iVar3 = *(int *)((long)__s + (long)(int)uVar2 * 4);
          if (iVar3 < iVar10) {
            pSVar6[iVar9] = pSVar6[lVar11];
            pIVar5[iVar9] = uVar2;
            *(int *)((long)__s + (long)(int)uVar2 * 4) = iVar9;
            iVar9 = iVar9 + 1;
          }
          else {
            pSVar6[iVar3] = pSVar6[lVar11] + pSVar6[iVar3];
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < lVar12);
      }
      pIVar4[lVar8] = iVar10;
      lVar8 = lVar8 + 1;
      lVar12 = (long)this->m_outerSize;
      iVar10 = iVar9;
    } while (lVar8 < lVar12);
  }
  pIVar4[lVar12] = iVar9;
  free(__ptr);
  this->m_innerNonZeros = (Index *)0x0;
  internal::CompressedStorage<double,_int>::resize
            (&this->m_data,(long)this->m_outerIndex[this->m_outerSize],0.0);
  free(__s);
  return;
}

Assistant:

void SparseMatrix<Scalar,_Options,_Index>::sumupDuplicates()
{
  eigen_assert(!isCompressed());
  // TODO, in practice we should be able to use m_innerNonZeros for that task
  Matrix<Index,Dynamic,1> wi(innerSize());
  wi.fill(-1);
  Index count = 0;
  // for each inner-vector, wi[inner_index] will hold the position of first element into the index/value buffers
  for(Index j=0; j<outerSize(); ++j)
  {
    Index start   = count;
    Index oldEnd  = m_outerIndex[j]+m_innerNonZeros[j];
    for(Index k=m_outerIndex[j]; k<oldEnd; ++k)
    {
      Index i = m_data.index(k);
      if(wi(i)>=start)
      {
        // we already meet this entry => accumulate it
        m_data.value(wi(i)) += m_data.value(k);
      }
      else
      {
        m_data.value(count) = m_data.value(k);
        m_data.index(count) = m_data.index(k);
        wi(i) = count;
        ++count;
      }
    }
    m_outerIndex[j] = start;
  }
  m_outerIndex[m_outerSize] = count;

  // turn the matrix into compressed form
  std::free(m_innerNonZeros);
  m_innerNonZeros = 0;
  m_data.resize(m_outerIndex[m_outerSize]);
}